

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

Box * __thiscall Rml::Element::GetBox(Element *this,int index,Vector2f *offset)

{
  pointer pPVar1;
  
  offset->x = 0.0;
  offset->y = 0.0;
  if ((0 < index) &&
     (pPVar1 = (this->additional_boxes).
               super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
               ._M_impl.super__Vector_impl_data._M_start,
     index <= (int)((ulong)((long)(this->additional_boxes).
                                  super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) >> 6)))
  {
    *offset = pPVar1[index - 1U].offset;
    return &(this->additional_boxes).
            super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
            ._M_impl.super__Vector_impl_data._M_start[index - 1U].box;
  }
  return &this->main_box;
}

Assistant:

const Box& Element::GetBox(int index, Vector2f& offset)
{
	offset = Vector2f(0);

	const int additional_box_index = index - 1;
	if (index < 1 || additional_box_index >= (int)additional_boxes.size())
		return main_box;

	offset = additional_boxes[additional_box_index].offset;
	return additional_boxes[additional_box_index].box;
}